

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O2

void __thiscall wasm::AccessInstrumenter::visitStore(AccessInstrumenter *this,Store *curr)

{
  size_type sVar1;
  Memory *pMVar2;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Name NVar3;
  Expression *local_78;
  Const *local_70;
  Expression *local_68;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  size_t local_48;
  Builder local_40;
  Builder builder;
  
  sVar1 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                    (&this->ignoreFunctions,
                     (key_type *)
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>_>
                     ).
                     super_PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
                     .
                     super_Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
                     .currFunction);
  if ((sVar1 == 0) &&
     ((curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id != 1)) {
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>_>
         ).
         super_PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>.
         super_Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>.
         currModule;
    pMVar2 = Module::getMemory(local_40.wasm,(Name)(curr->memory).super_IString.str);
    NVar3 = getStoreName(curr);
    local_48 = NVar3.super_IString.str._M_len;
    local_78 = curr->ptr;
    local_70 = Builder::makeConstPtr(&local_40,(curr->offset).addr,(Type)(pMVar2->addressType).id);
    local_68 = curr->value;
    __l._M_len = 3;
    __l._M_array = &local_78;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_60,__l,
               (allocator_type *)((long)&builder.wasm + 7));
    NVar3.super_IString.str._M_len = local_48;
    expression = Builder::makeCall(&local_40,NVar3,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&local_60,(Type)0x0,false);
    Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>_>
                ).
                super_PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
                .
                super_Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
               ,(Expression *)expression);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_60);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (ignoreFunctions.count(getFunction()->name) != 0 ||
        curr->type == Type::unreachable) {
      return;
    }
    Builder builder(*getModule());
    auto memory = getModule()->getMemory(curr->memory);
    replaceCurrent(builder.makeCall(
      getStoreName(curr),
      {curr->ptr,
       builder.makeConstPtr(curr->offset.addr, memory->addressType),
       curr->value},
      Type::none));
  }